

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_8b29c::data<float>::setUpFrameBuffer
          (data<float> *this,vector<float,_std::allocator<float>_> *data,FrameBuffer *framebuf,
          Box2i *dw,bool dontbotherloadingdepth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *name;
  int iVar4;
  pointer pbVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  pointer pbVar9;
  long lVar10;
  Slice local_68;
  
  iVar4 = (dw->max).x;
  iVar1 = (dw->min).x;
  iVar2 = (dw->max).y;
  iVar3 = (dw->min).y;
  lVar8 = (long)((iVar4 - iVar1) + 1);
  if (iVar2 < iVar3 || iVar4 < iVar1) {
    lVar8 = 1;
  }
  lVar6 = (long)((iVar2 - iVar3) + 1);
  if (iVar2 < iVar3 || iVar4 < iVar1) {
    lVar6 = 1;
  }
  std::vector<float,_std::allocator<float>_>::resize
            (data,lVar8 * ((long)(this->_channels).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_channels).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5) * lVar6);
  pbVar9 = (this->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar9) {
    lVar6 = 0;
    lVar8 = 0;
    uVar7 = 0;
    do {
      if (dontbotherloadingdepth) {
        iVar4 = std::__cxx11::string::compare((char *)((long)&(pbVar9->_M_dataplus)._M_p + lVar8));
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((long)&(((this->_channels).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar8));
          if (iVar4 != 0) {
            pbVar9 = (this->_channels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pbVar5 = (this->_channels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            goto LAB_001332b3;
          }
        }
      }
      else {
LAB_001332b3:
        iVar1 = (dw->min).x;
        iVar2 = (dw->min).y;
        iVar3 = (dw->max).x;
        iVar4 = (iVar3 - iVar1) + 1;
        if ((dw->max).y < iVar2) {
          iVar4 = 1;
        }
        name = *(char **)((long)&(pbVar9->_M_dataplus)._M_p + lVar8);
        if (iVar3 < iVar1) {
          iVar4 = 1;
        }
        lVar10 = (long)pbVar5 - (long)pbVar9 >> 5;
        Imf_2_5::Slice::Slice
                  (&local_68,this->_type,
                   (char *)((long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                  super__Vector_impl_data._M_start +
                           lVar6 + (iVar2 * iVar4 + iVar1) * lVar10 * -4),
                   (long)pbVar5 - (long)pbVar9 >> 3,iVar4 * lVar10 * 4,1,1,0.0,true,false);
        Imf_2_5::FrameBuffer::insert(framebuf,name,&local_68);
      }
      uVar7 = uVar7 + 1;
      pbVar9 = (this->_channels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (this->_channels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = lVar8 + 0x20;
      lVar6 = lVar6 + 4;
    } while (uVar7 < (ulong)((long)pbVar5 - (long)pbVar9 >> 5));
  }
  return;
}

Assistant:

void 
    setUpFrameBuffer(vector<T> & data,FrameBuffer & framebuf,const Box2i & dw,bool dontbotherloadingdepth) const
    {
        
        // allocate enough space for all channels (even the depth channel)
        data.resize(_channels.size()*(dw.size().x+1)*(dw.size().y+1));
        for(size_t i=0;i<_channels.size();i++)
        {
            if(!dontbotherloadingdepth || (_channels[i]!="Z" && _channels[i]!="ZBack") )
            {
                framebuf.insert(_channels[i].c_str(),
                                Slice(_type,(char *) (&data[i] - (dw.min.x + dw.min.y*(dw.size().x+1))*_channels.size() ),
                                      sizeof(T)*_channels.size(),
                                      sizeof(T)*(dw.size().x+1)*_channels.size())
                                      );
            }
        }
    }